

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_fold.c
# Opt level: O0

TRef fold_simplify_numpow_xk(jit_State *J)

{
  undefined2 uVar1;
  TRef TVar2;
  uint uVar3;
  uint64_t in_RDI;
  TRef tmp;
  TRef ref;
  int32_t k;
  uint64_t in_stack_ffffffffffffff78;
  uint64_t uVar4;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  uint local_64;
  
  uVar3 = *(uint *)(in_RDI + 0xa8);
  local_64 = (uint)*(ushort *)(in_RDI + 0x98);
  if (uVar3 == 0) {
    local_64 = lj_ir_knum_u64((jit_State *)
                              CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                              in_stack_ffffffffffffff78);
  }
  else if (uVar3 == 1) {
    local_64 = (uint)*(ushort *)(in_RDI + 0x98);
  }
  else if (uVar3 + 0x10000 < 0x20001) {
    if ((int)uVar3 < 0) {
      uVar4 = in_RDI;
      TVar2 = lj_ir_knum_u64((jit_State *)
                             CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),in_RDI);
      *(undefined2 *)(uVar4 + 0x9c) = 0x2b0e;
      *(short *)(uVar4 + 0x98) = (short)TVar2;
      *(short *)(uVar4 + 0x9a) = (short)local_64;
      local_64 = lj_opt_fold((jit_State *)CONCAT44(uVar3,local_64));
      uVar3 = -uVar3;
    }
    for (; uVar1 = (undefined2)local_64, (uVar3 & 1) == 0; uVar3 = (int)uVar3 >> 1) {
      *(undefined2 *)(in_RDI + 0x9c) = 0x2a0e;
      *(undefined2 *)(in_RDI + 0x98) = uVar1;
      *(undefined2 *)(in_RDI + 0x9a) = uVar1;
      local_64 = lj_opt_fold((jit_State *)CONCAT44(uVar3,local_64));
    }
    uVar3 = (int)uVar3 >> 1;
    if (uVar3 != 0) {
      *(undefined2 *)(in_RDI + 0x9c) = 0x2a0e;
      *(undefined2 *)(in_RDI + 0x98) = uVar1;
      *(undefined2 *)(in_RDI + 0x9a) = uVar1;
      TVar2 = lj_opt_fold((jit_State *)CONCAT44(uVar3,local_64));
      while( true ) {
        uVar1 = (undefined2)TVar2;
        if (uVar3 == 1) break;
        if ((uVar3 & 1) != 0) {
          *(undefined2 *)(in_RDI + 0x9c) = 0x2a0e;
          *(short *)(in_RDI + 0x98) = (short)local_64;
          *(undefined2 *)(in_RDI + 0x9a) = uVar1;
          local_64 = lj_opt_fold((jit_State *)CONCAT44(uVar3,local_64));
        }
        *(undefined2 *)(in_RDI + 0x9c) = 0x2a0e;
        *(undefined2 *)(in_RDI + 0x98) = uVar1;
        *(undefined2 *)(in_RDI + 0x9a) = uVar1;
        TVar2 = lj_opt_fold((jit_State *)CONCAT44(uVar3,local_64));
        uVar3 = (int)uVar3 >> 1;
      }
      *(undefined2 *)(in_RDI + 0x9c) = 0x2a0e;
      *(short *)(in_RDI + 0x98) = (short)local_64;
      *(undefined2 *)(in_RDI + 0x9a) = uVar1;
      local_64 = lj_opt_fold((jit_State *)CONCAT44(1,local_64));
    }
  }
  else {
    local_64 = 0;
  }
  return local_64;
}

Assistant:

LJFOLD(POW any KINT)
LJFOLDF(simplify_numpow_xk)
{
  int32_t k = fright->i;
  TRef ref = fins->op1;
  if (k == 0)  /* x ^ 0 ==> 1 */
    return lj_ir_knum_one(J);  /* Result must be a number, not an int. */
  if (k == 1)  /* x ^ 1 ==> x */
    return LEFTFOLD;
  if ((uint32_t)(k+65536) > 2*65536u)  /* Limit code explosion. */
    return NEXTFOLD;
  if (k < 0) {  /* x ^ (-k) ==> (1/x) ^ k. */
    ref = emitir(IRTN(IR_DIV), lj_ir_knum_one(J), ref);
    k = -k;
  }
  /* Unroll x^k for 1 <= k <= 65536. */
  for (; (k & 1) == 0; k >>= 1)  /* Handle leading zeros. */
    ref = emitir(IRTN(IR_MUL), ref, ref);
  if ((k >>= 1) != 0) {  /* Handle trailing bits. */
    TRef tmp = emitir(IRTN(IR_MUL), ref, ref);
    for (; k != 1; k >>= 1) {
      if (k & 1)
	ref = emitir(IRTN(IR_MUL), ref, tmp);
      tmp = emitir(IRTN(IR_MUL), tmp, tmp);
    }
    ref = emitir(IRTN(IR_MUL), ref, tmp);
  }
  return ref;
}